

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O0

void GGMTree::derive_key_from_tree
               (uint8_t *current_key,long offset,int start_level,int target_level)

{
  undefined4 local_40;
  int local_3c;
  int k_bit;
  int k;
  uint8_t next_key [16];
  int target_level_local;
  int start_level_local;
  long offset_local;
  uint8_t *current_key_local;
  
  local_3c = start_level;
  if (start_level != target_level) {
    for (; target_level < local_3c; local_3c = local_3c + -1) {
      local_40 = (undefined4)
                 ((offset & 1 << ((char)local_3c - 1U & 0x1f)) >> ((char)local_3c - 1U & 0x3f));
      key_derivation((uchar *)&local_40,4,current_key,0x10,(uchar *)&k_bit);
      *(undefined8 *)current_key = _k_bit;
      *(undefined8 *)(current_key + 8) = next_key._0_8_;
    }
  }
  return;
}

Assistant:

void GGMTree::derive_key_from_tree(uint8_t *current_key, long offset, int start_level, int target_level) {
    uint8_t next_key[AES_BLOCK_SIZE];
    // does not need to derive
    if(start_level == target_level) return;
    // derive tag
    for (int k = start_level; k > target_level; --k) {
        int k_bit = (offset & (1 << (k - 1))) >> (k - 1);
        key_derivation((uint8_t*) &k_bit, sizeof(int),
                       current_key, AES_BLOCK_SIZE,
                       next_key);
        memcpy(current_key, next_key, AES_BLOCK_SIZE);
    }
}